

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O2

int set_file_offset(stb_vorbis *f,uint loc)

{
  int iVar1;
  uint8 *puVar2;
  int64_t iVar3;
  
  f->eof = 0;
  if (f->stream == (uint8 *)0x0) {
    iVar1 = f->f_start + loc;
    if ((int)loc < 0 || CARRY4(f->f_start,loc)) {
      f->eof = 1;
      iVar1 = 0x7fffffff;
    }
    puVar2 = (uint8 *)(*f->f->seek)(f->f->data,(int64_t)iVar1,0);
    if (puVar2 == (uint8 *)0xffffffffffffffff) {
      f->eof = 1;
      iVar3 = (*f->f->seek)(f->f->data,(int64_t)f->f_start,2);
      return (int)iVar3;
    }
  }
  else {
    puVar2 = f->stream_start + loc;
    if (puVar2 < f->stream_end) {
      f->stream = puVar2;
    }
    else {
      f->stream = f->stream_end;
      f->eof = 1;
    }
  }
  return (int)puVar2;
}

Assistant:

static int set_file_offset(stb_vorbis *f, unsigned int loc)
{
   #ifndef STB_VORBIS_NO_PUSHDATA_API
   if (f->push_mode) return 0;
   #endif
   f->eof = 0;
   if (USE_MEMORY(f)) {
      if (f->stream_start + loc >= f->stream_end || f->stream_start + loc < f->stream_start) {
         f->stream = f->stream_end;
         f->eof = 1;
         return 0;
      } else {
         f->stream = f->stream_start + loc;
         return 1;
      }
   }
   #ifndef STB_VORBIS_NO_STDIO
   if (loc + f->f_start < loc || loc >= 0x80000000) {
      loc = 0x7fffffff;
      f->eof = 1;
   } else {
      loc += f->f_start;
   }
   if (fseek(f->f, loc, SEEK_SET) != -1) /* FAudio change! */
      return 1;
   f->eof = 1;
   fseek(f->f, f->f_start, SEEK_END);
   return 0;
   #endif
}